

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_is_bit_set(BIGNUM *a,int n)

{
  int j;
  int i;
  int n_local;
  BIGNUM *a_local;
  uint local_4;
  
  if (n < 0) {
    local_4 = 0;
  }
  else if (n / 0x40 < a->top) {
    local_4 = (uint)(a->d[n / 0x40] >> ((byte)(n % 0x40) & 0x3f)) & 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BN_is_bit_set(const BIGNUM *a, int n)
{
    int i, j;

    bn_check_top(a);
    if (n < 0)
        return 0;
    i = n / BN_BITS2;
    j = n % BN_BITS2;
    if (a->top <= i)
        return 0;
    return (int)(((a->d[i]) >> j) & ((BN_ULONG)1));
}